

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O3

void WebRtcIsac_InitPitchAnalysis(PitchAnalysisStruct *State)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  lVar1 = 0;
  memset(State,0,0xa10);
  (State->PFstr_wght).oldlagp[0] = 50.0;
  memset((State->PFstr_wght).oldgainp,0,0x620);
  (State->PFstr).oldlagp[0] = 50.0;
  memset((State->PFstr).oldgainp,0,0x818);
  dVar3 = 0.5;
  do {
    dVar2 = sin((dVar3 * 0.3 * 0.004166666666666667 + dVar3 * 0.7 * dVar3 * 1.736111111111111e-05) *
                3.14159265);
    (State->Wghtstr).window[lVar1] = dVar2 * dVar2;
    dVar3 = dVar3 + 1.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xf0);
  return;
}

Assistant:

void WebRtcIsac_InitPitchAnalysis(PitchAnalysisStruct *State)
{
  int k;

  for (k = 0; k < PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2; k++)
    State->dec_buffer[k] = 0.0;
  for (k = 0; k < 2*ALLPASSSECTIONS+1; k++)
    State->decimator_state[k] = 0.0;
  for (k = 0; k < 2; k++)
    State->hp_state[k] = 0.0;
  for (k = 0; k < QLOOKAHEAD; k++)
    State->whitened_buf[k] = 0.0;
  for (k = 0; k < QLOOKAHEAD; k++)
    State->inbuf[k] = 0.0;

  WebRtcIsac_InitPitchFilter(&(State->PFstr_wght));

  WebRtcIsac_InitPitchFilter(&(State->PFstr));

  WebRtcIsac_InitWeightingFilter(&(State->Wghtstr));
}